

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  pointer ppCVar2;
  bool bVar3;
  byte bVar4;
  __type _Var5;
  uint __seed;
  _Ios_Openmode _Var6;
  ostream *poVar7;
  char *pcVar8;
  _func_uint64_t *p_Var9;
  char *pcVar10;
  Mem<r_exec::LObject,_r_exec::MemStatic> *this;
  Mem<r_exec::LObject,_r_exec::MemVolatile> *this_00;
  vector<r_code::Code_*,_std::allocator<r_code::Code_*>_> *pvVar11;
  DebugStream *pDVar12;
  Image *pIVar13;
  undefined4 in_stack_fffffffffffff31c;
  Decompiler *local_c98;
  Decompiler *local_c58;
  streambuf *coutbuf_1;
  ofstream outfile_1;
  Image *image_1;
  streambuf *coutbuf;
  ofstream outfile;
  Image *image;
  string local_718 [39];
  string local_6f1;
  duration<long,_std::ratio<1L,_1000L>_> local_6f0;
  allocator local_6e1;
  string local_6e0 [39];
  string local_6b9;
  uint64_t local_6b8;
  uint64_t starting_time;
  pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *symbol;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  const_iterator n;
  string local_680 [8];
  string self_symbol;
  uint64_t self_oid;
  string local_650 [8];
  string stdout_symbol;
  ulong local_630;
  uint64_t stdout_oid;
  string local_620 [8];
  string stdin_symbol;
  ulong local_600;
  uint64_t stdin_oid;
  vector<r_code::Code_*> ram_objects;
  _Mem *mem;
  Decompiler decompiler;
  allocator local_481;
  string local_480 [39];
  string local_459;
  string local_458 [8];
  string error;
  allocator local_431;
  string local_430 [39];
  string local_409;
  undefined4 local_408;
  __0 local_402;
  allocator local_401;
  string local_400 [39];
  string local_3d9;
  undefined1 local_3d8 [8];
  Metadata metadata;
  Image local_298 [8];
  Image seed;
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  auStack_228 [80];
  undefined1 local_1d8 [8];
  Settings settings;
  char **argv_local;
  int argc_local;
  
  settings._400_8_ = argv;
  Settings::Settings((Settings *)local_1d8);
  bVar3 = fileExists("settings.ini");
  if (bVar3) {
    Settings::load((Settings *)local_1d8,"settings.ini");
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,"loading from home");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    Settings::load((Settings *)local_1d8,"~/.config/replicode/replicode.conf");
  }
  r_comp::Image::Image(local_298);
  r_comp::Metadata::Metadata((Metadata *)local_3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"main",&local_401);
  debug(&local_3d9);
  DebugStream::operator<<
            ((DebugStream *)&local_3d9,
             "Initializing with user operator library and user class code...");
  DebugStream::~DebugStream((DebugStream *)&local_3d9);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  p_Var9 = main::$_0::operator_cast_to_function_pointer(&local_402);
  pcVar10 = (char *)std::__cxx11::string::c_str();
  bVar4 = r_exec::Init(pcVar8,(_func_ulong *)p_Var9,pcVar10,local_298,(Metadata *)local_3d8);
  if (((bVar4 ^ 0xff) & 1) == 0) {
    __seed = (*r_exec::Now)();
    srand(__seed);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_430,"main",&local_431);
    debug(&local_409);
    DebugStream::operator<<((DebugStream *)&local_409,"compiling source...");
    DebugStream::~DebugStream((DebugStream *)&local_409);
    std::__cxx11::string::~string(local_430);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    std::__cxx11::string::string(local_458);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    bVar4 = r_exec::Compile(pcVar8,local_458,local_298,(Metadata *)local_3d8,false);
    if ((bVar4 & 1) == 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr," <- ");
      poVar7 = std::operator<<(poVar7,local_458);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 3;
      local_408 = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_480,"main",&local_481);
      debug(&local_459);
      DebugStream::operator<<((DebugStream *)&local_459,"source compiled!");
      DebugStream::~DebugStream((DebugStream *)&local_459);
      std::__cxx11::string::~string(local_480);
      std::allocator<char>::~allocator((allocator<char> *)&local_481);
      r_comp::Decompiler::Decompiler((Decompiler *)&mem);
      r_comp::Decompiler::init((Metadata *)&mem);
      if (((byte)settings.trace_levels & 1) == 0) {
        this_00 = (Mem<r_exec::LObject,_r_exec::MemVolatile> *)operator_new(0x4e8);
        r_exec::Mem<r_exec::LObject,_r_exec::MemVolatile>::Mem(this_00);
        ram_objects.m_vector.super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this_00;
      }
      else {
        this = (Mem<r_exec::LObject,_r_exec::MemStatic> *)operator_new(0x510);
        r_exec::Mem<r_exec::LObject,_r_exec::MemStatic>::Mem(this);
        ram_objects.m_vector.super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
      }
      r_code::vector<r_code::Code_*>::vector((vector<r_code::Code_*> *)&stdin_oid);
      r_comp::Image::get_objects
                ((Mem *)local_298,
                 (vector *)
                 ram_objects.m_vector.
                 super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      ram_objects.m_vector.super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage[0x9b] = (Code *)local_3d8;
      r_exec::_Mem::init((ulong)ram_objects.m_vector.
                                super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,settings._88_8_,
                         settings.base_period,(double)settings.time_core_count,
                         settings.reduction_core_count,(double)settings.mdl_inertia_cnt_thr,
                         (ulong)settings.mdl_inertia_sr_thr,(ulong)settings.tpx_dsr_thr,
                         (double)settings.max_sim_time_horizon,settings.min_sim_time_horizon,
                         (ulong)settings.sim_time_horizon,(double)settings.perf_sampling_period,
                         settings.tpx_time_horizon,(ulong)settings.float_tolerance,
                         settings.time_tolerance,(bool)(undefined1)settings.primary_thz,
                         CONCAT44(in_stack_fffffffffffff31c,(uint)(byte)settings.secondary_thz) &
                         0xffffffff00000001,settings._216_8_,settings.ntf_mk_resilience,
                         settings.run_time);
      local_600 = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_620,"stdin",(allocator *)((long)&stdout_oid + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&stdout_oid + 7));
      local_630 = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_650,"stdout",(allocator *)((long)&self_oid + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&self_oid + 7));
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_680,"self",
                 (allocator *)
                 ((long)&n.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                         ._M_cur + 7));
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&n.
                         super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                         ._M_cur + 7));
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
      ::_Node_const_iterator
                ((_Node_const_iterator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                  *)&__range1);
      __end1 = std::
               unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(auStack_228);
      symbol = (pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::
                  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::end(auStack_228);
      while (bVar3 = std::__detail::operator!=
                               (&__end1.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                  *)&symbol),
            ppCVar2 = ram_objects.m_vector.
                      super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage, bVar3) {
        starting_time =
             (uint64_t)
             std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
             ::operator*(&__end1);
        _Var5 = std::operator==(&((reference)starting_time)->second,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_620);
        if (_Var5) {
          local_600 = (ulong)*(uint *)starting_time;
        }
        else {
          _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(starting_time + 8),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_650);
          if (_Var5) {
            local_630 = (ulong)*(uint *)starting_time;
          }
          else {
            std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (starting_time + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_680);
          }
        }
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
        ::operator++(&__end1);
      }
      pvVar11 = r_code::vector<r_code::Code_*>::as_std((vector<r_code::Code_*> *)&stdin_oid);
      bVar4 = r_exec::_Mem::load((vector *)ppCVar2,(ulong)pvVar11,local_600,local_630);
      if ((bVar4 & 1) == 0) {
        argv_local._4_4_ = 4;
      }
      else {
        local_6b8 = r_exec::_Mem::start();
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_6e0,"main",&local_6e1);
        debug(&local_6b9);
        pDVar12 = DebugStream::operator<<((DebugStream *)&local_6b9,"running for");
        pDVar12 = DebugStream::operator<<(pDVar12,settings._336_8_);
        DebugStream::operator<<(pDVar12,"ms");
        DebugStream::~DebugStream((DebugStream *)&local_6b9);
        std::__cxx11::string::~string(local_6e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_long,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&local_6f0,
                   (unsigned_long *)&settings.test_objects);
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_6f0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_718,"main",(allocator *)((long)&image + 7));
        debug(&local_6f1);
        DebugStream::operator<<((DebugStream *)&local_6f1,"shutting rMem down...");
        DebugStream::~DebugStream((DebugStream *)&local_6f1);
        std::__cxx11::string::~string(local_718);
        std::allocator<char>::~allocator((allocator<char> *)((long)&image + 7));
        r_exec::_Mem::stop();
        if (((byte)settings.trace_levels & 1) != 0) {
          pIVar13 = (Image *)(*(code *)((*ram_objects.m_vector.
                                          super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->views
                                       )._M_h._M_buckets)();
          std::
          unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=((unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(pIVar13 + 0x70),
                      (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(pIVar13 + 0x70));
          if ((settings._289_1_ & 1) != 0) {
            if ((settings._328_1_ & 1) == 0) {
              local_c58 = (Decompiler *)0x0;
            }
            else {
              local_c58 = (Decompiler *)&mem;
            }
            write_to_file(pIVar13,(string *)&settings.ignore_named_objects,local_c58,local_6b8);
          }
          if (((settings.trace_levels._1_1_ & 1) != 0) &&
             (((settings._289_1_ & 1) == 0 || ((settings._328_1_ & 1) == 0)))) {
            if ((settings.trace_levels._2_1_ & 1) == 0) {
              decompile((Decompiler *)&mem,pIVar13,local_6b8,(bool)(settings._288_1_ & 1));
            }
            else {
              std::ofstream::ofstream(&coutbuf);
              _Var6 = std::__cxx11::string::c_str();
              std::ofstream::open((char *)&coutbuf,_Var6);
              lVar1 = *(long *)(std::cout + -0x18);
              std::ofstream::rdbuf();
              std::ios::rdbuf((streambuf *)((long)&std::cout + lVar1));
              decompile((Decompiler *)&mem,pIVar13,local_6b8,(bool)(settings._288_1_ & 1));
              std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
              std::ofstream::close();
              std::ofstream::~ofstream(&coutbuf);
            }
          }
          if (pIVar13 != (Image *)0x0) {
            r_comp::Image::~Image(pIVar13);
            operator_delete(pIVar13);
          }
        }
        if (((byte)settings.probe_level & 1) != 0) {
          pIVar13 = (Image *)r_exec::_Mem::get_models();
          std::
          unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=((unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(pIVar13 + 0x70),
                      (unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(pIVar13 + 0x70));
          if ((settings.probe_level._3_1_ & 1) != 0) {
            if ((settings._392_1_ & 1) == 0) {
              local_c98 = (Decompiler *)0x0;
            }
            else {
              local_c98 = (Decompiler *)&mem;
            }
            write_to_file(pIVar13,(string *)&settings.get_models,local_c98,local_6b8);
          }
          if (((settings.probe_level._1_1_ & 1) != 0) &&
             (((settings.probe_level._3_1_ & 1) == 0 || ((settings._392_1_ & 1) == 0)))) {
            if (argc < 3) {
              decompile((Decompiler *)&mem,pIVar13,local_6b8,(bool)(settings.probe_level._2_1_ & 1))
              ;
            }
            else {
              std::ofstream::ofstream(&coutbuf_1);
              std::ofstream::open((char *)&coutbuf_1,
                                  (_Ios_Openmode)*(undefined8 *)(settings._400_8_ + 0x10));
              lVar1 = *(long *)(std::cout + -0x18);
              std::ofstream::rdbuf();
              std::ios::rdbuf((streambuf *)((long)&std::cout + lVar1));
              decompile((Decompiler *)&mem,pIVar13,local_6b8,(bool)(settings.probe_level._2_1_ & 1))
              ;
              std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
              std::ofstream::close();
              std::ofstream::~ofstream(&coutbuf_1);
            }
          }
          if (pIVar13 != (Image *)0x0) {
            r_comp::Image::~Image(pIVar13);
            operator_delete(pIVar13);
          }
        }
        r_comp::RepliStruct::cleanup();
        if (ram_objects.m_vector.super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          (*(code *)((*ram_objects.m_vector.
                       super__Vector_base<r_code::Code_*,_std::allocator<r_code::Code_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->markers).cells.
                    super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)();
        }
        argv_local._4_4_ = 0;
      }
      local_408 = 1;
      std::__cxx11::string::~string(local_680);
      std::__cxx11::string::~string(local_650);
      std::__cxx11::string::~string(local_620);
      r_code::vector<r_code::Code_*>::~vector((vector<r_code::Code_*> *)&stdin_oid);
      r_comp::Decompiler::~Decompiler((Decompiler *)&mem);
    }
    std::__cxx11::string::~string(local_458);
  }
  else {
    argv_local._4_4_ = 2;
    local_408 = 1;
  }
  r_comp::Metadata::~Metadata((Metadata *)local_3d8);
  r_comp::Image::~Image(local_298);
  Settings::~Settings((Settings *)local_1d8);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    Settings settings;

    // First try to load local config, otherwise user config, otherwise just
    // use default values
    if (fileExists("settings.ini")) {
        settings.load("settings.ini");
    } else {
        std::cout << "loading from home" << std::endl;
        settings.load("~/.config/replicode/replicode.conf");
    }

    r_comp::Image seed;
    r_comp::Metadata metadata;
    debug("main") << "Initializing with user operator library and user class code...";
    using namespace std::chrono;

    if (!r_exec::Init(settings.usr_operator_path.c_str(),
                      []() -> uint64_t {
                         return duration_cast<microseconds>(high_resolution_clock::now().time_since_epoch()).count();
                      },
                      settings.usr_class_path.c_str(),
                      &seed,
                      &metadata)) {
        return 2;
    }
    srand(r_exec::Now());
    debug("main") << "compiling source...";
    std::string error;

    if (!r_exec::Compile(settings.source_file_name.c_str(), error, &seed, &metadata, false)) {
        std::cerr << " <- " << error << std::endl;
        return 3;
    }

    debug("main") << "source compiled!";
#if defined(WIN32) || defined(WIN64)
    r_exec::PipeOStream::Open(settings.debug_windows);
#endif
    Decompiler decompiler;
    decompiler.init(&metadata);
    r_exec::_Mem *mem;

    if (settings.get_objects) {
        mem = new r_exec::Mem<r_exec::LObject, r_exec::MemStatic>();
    } else {
        mem = new r_exec::Mem<r_exec::LObject, r_exec::MemVolatile>();
    }

    r_code::vector<r_code::Code *> ram_objects;
    seed.get_objects(mem, ram_objects);
    mem->metadata = &metadata;
    mem->init(settings.base_period,
              settings.reduction_core_count,
              settings.time_core_count,
              settings.mdl_inertia_sr_thr,
              settings.mdl_inertia_cnt_thr,
              settings.tpx_dsr_thr,
              settings.min_sim_time_horizon,
              settings.max_sim_time_horizon,
              settings.sim_time_horizon,
              settings.tpx_time_horizon,
              settings.perf_sampling_period,
              settings.float_tolerance,
              settings.time_tolerance,
              settings.primary_thz,
              settings.secondary_thz,
              settings.debug,
              settings.ntf_mk_resilience,
              settings.goal_pred_success_resilience,
              settings.probe_level,
              settings.trace_levels);
    uint64_t stdin_oid = 0;
    std::string stdin_symbol("stdin");
    uint64_t stdout_oid = 0;
    std::string stdout_symbol("stdout");
    uint64_t self_oid = 0;
    std::string self_symbol("self");
    std::unordered_map<uintptr_t, std::string>::const_iterator n;

    for (const auto &symbol : seed.object_names.symbols) {
        if (symbol.second == stdin_symbol) {
            stdin_oid = symbol.first;
        } else if (symbol.second == stdout_symbol) {
            stdout_oid = symbol.first;
        } else if (symbol.second == self_symbol) {
            self_oid = symbol.first;
        }
    }

    if (!mem->load(ram_objects.as_std(), stdin_oid, stdout_oid, self_oid)) {
        return 4;
    }

    uint64_t starting_time = mem->start();
    debug("main") << "running for" << settings.run_time << "ms";
    std::this_thread::sleep_for(std::chrono::milliseconds(settings.run_time));
    /*Thread::Sleep(settings.run_time/2);
      test_many_injections(mem,
      argc > 2 ? atoi(argv[2]) : 100, // sampling period in ms
      argc > 3 ? atoi(argv[3]) : 600, // number of batches
      argc > 4 ? atoi(argv[4]) : 66); // number of objects per batch
      Thread::Sleep(settings.run_time/2);*/
    debug("main") << "shutting rMem down...";
    mem->stop();

    if (settings.get_objects) {
        //TimeProbe probe;
        //probe.set();
        r_comp::Image *image = mem->get_objects();
        //probe.check();
        image->object_names.symbols = image->object_names.symbols;

        if (settings.write_objects) {
            write_to_file(image, settings.objects_path, settings.test_objects ? &decompiler : nullptr, starting_time);
        }

        if (settings.decompile_objects && (!settings.write_objects || !settings.test_objects)) {
            if (settings.decompile_to_file) { // argv[2] is a file to redirect the decompiled code to.
                std::ofstream outfile;
                outfile.open(settings.decompilation_file_path.c_str(), std::ios_base::trunc);
                std::streambuf *coutbuf = std::cout.rdbuf(outfile.rdbuf());
                decompile(decompiler, image, starting_time, settings.ignore_named_objects);
                std::cout.rdbuf(coutbuf);
                outfile.close();
            } else {
                decompile(decompiler, image, starting_time, settings.ignore_named_objects);
            }
        }

        delete image;
        //std::cout<<"get_image(): "<<probe.us()<<"us"<<std::endl;
    }

    if (settings.get_models) {
        //TimeProbe probe;
        //probe.set();
        r_comp::Image *image = mem->get_models();
        //probe.check();
        image->object_names.symbols = image->object_names.symbols;

        if (settings.write_models) {
            write_to_file(image, settings.models_path, settings.test_models ? &decompiler : nullptr, starting_time);
        }

        if (settings.decompile_models && (!settings.write_models || !settings.test_models)) {
            if (argc > 2) { // argv[2] is a file to redirect the decompiled code to.
                std::ofstream outfile;
                outfile.open(argv[2], std::ios_base::trunc);
                std::streambuf *coutbuf = std::cout.rdbuf(outfile.rdbuf());
                decompile(decompiler, image, starting_time, settings.ignore_named_models);
                std::cout.rdbuf(coutbuf);
                outfile.close();
            } else {
                decompile(decompiler, image, starting_time, settings.ignore_named_models);
            }
        }

        delete image;
        //std::cout<<"get_models(): "<<probe.us()<<"us"<<std::endl;
    }
    RepliStruct::cleanup();

    delete mem;
#if defined(WIN32) || defined(WIN64)
    r_exec::PipeOStream::Close();
#endif
    return 0;
}